

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O2

uint64_t flatbuffers::anon_unknown_0::HashFile(char *source_filename,char *source)

{
  unsigned_long uVar1;
  unsigned_long uVar2;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  if (source_filename == (char *)0x0) {
    uVar1 = 0;
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,source_filename,&local_59);
    StripPath(&local_38,&local_58);
    uVar1 = HashFnv1a<unsigned_long>(local_38._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  if ((source != (char *)0x0) && (*source != '\0')) {
    uVar2 = HashFnv1a<unsigned_long>(source);
    uVar1 = uVar1 ^ uVar2;
  }
  return uVar1;
}

Assistant:

static uint64_t HashFile(const char *source_filename, const char *source) {
  uint64_t hash = 0;

  if (source_filename)
    hash = HashFnv1a<uint64_t>(StripPath(source_filename).c_str());

  if (source && *source) hash ^= HashFnv1a<uint64_t>(source);

  return hash;
}